

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O1

void enet_peer_remove_incoming_commands
               (ENetList *queue,ENetListIterator startCommand,ENetListIterator endCommand)

{
  ENetListIterator pEVar1;
  ENetPacket *packet;
  ENetListIterator currentCommand;
  ENetIncomingCommand *incomingCommand;
  
  if (&queue->sentinel != startCommand) {
    do {
      pEVar1 = (queue->sentinel).next;
      enet_list_remove(&queue->sentinel);
      packet = (ENetPacket *)(&queue->sentinel)[5].previous;
      if ((packet != (ENetPacket *)0x0) &&
         (packet->referenceCount = packet->referenceCount - 1, packet->referenceCount == 0)) {
        enet_packet_destroy(packet);
      }
      if ((&queue->sentinel)[5].next != (_ENetListNode *)0x0) {
        enet_free((&queue->sentinel)[5].next);
      }
      enet_free(queue);
      queue = (ENetList *)pEVar1;
    } while (pEVar1 != startCommand);
  }
  return;
}

Assistant:

static void
enet_peer_remove_incoming_commands (ENetList * queue, ENetListIterator startCommand, ENetListIterator endCommand)
{
    ENetListIterator currentCommand;    
    
    for (currentCommand = startCommand; currentCommand != endCommand; )
    {
       ENetIncomingCommand * incomingCommand = (ENetIncomingCommand *) currentCommand;

       currentCommand = enet_list_next (currentCommand);

       enet_list_remove (& incomingCommand -> incomingCommandList);
 
       if (incomingCommand -> packet != NULL)
       {
          -- incomingCommand -> packet -> referenceCount;

          if (incomingCommand -> packet -> referenceCount == 0)
            enet_packet_destroy (incomingCommand -> packet);
       }

       if (incomingCommand -> fragments != NULL)
         enet_free (incomingCommand -> fragments);

       enet_free (incomingCommand);
    }
}